

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

int anon_unknown.dwarf_43725f::WindowsImplX11Impl::checkEvent
              (Display *param_1,XEvent *event,XPointer userData)

{
  int iVar1;
  Atom AVar2;
  long in_RDX;
  int *in_RSI;
  allocator local_41;
  string local_40 [23];
  undefined1 in_stack_ffffffffffffffd7;
  string *in_stack_ffffffffffffffd8;
  uint local_4;
  
  if (*(long *)(in_RSI + 8) == in_RDX) {
    local_4 = 1;
  }
  else if (*in_RSI == 0x21) {
    if ((anonymous_namespace)::WindowsImplX11Impl::checkEvent(_XDisplay*,_XEvent*,char*)::
        wmProtocols == '\0') {
      iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::WindowsImplX11Impl::
                                   checkEvent(_XDisplay*,_XEvent*,char*)::wmProtocols);
      if (iVar1 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_40,"WM_PROTOCOLS",&local_41);
        AVar2 = sf::priv::getAtom(in_stack_ffffffffffffffd8,(bool)in_stack_ffffffffffffffd7);
        std::__cxx11::string::~string(local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        checkEvent::wmProtocols = AVar2;
        __cxa_guard_release(&(anonymous_namespace)::WindowsImplX11Impl::
                             checkEvent(_XDisplay*,_XEvent*,char*)::wmProtocols);
      }
    }
    local_4 = (uint)(*(Atom *)(in_RSI + 10) != checkEvent::wmProtocols);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Bool checkEvent(::Display*, XEvent* event, XPointer userData)
        {
            if (event->xany.window == reinterpret_cast<::Window>(userData))
            {
                // The event matches the current window so pick it up
                return true;
            }
            if (event->type == ClientMessage)
            {
                // The input method sometimes sends ClientMessage with a different window ID.
                // Our event loop has to process them for the IM to work.
                // We assume ClientMessage events not having WM_PROTOCOLS message type are such events.
                // ClientMessage events having WM_PROTOCOLS message type should be handled by their own window,
                // so we ignore them here. They will eventually be picked up with the first condition.
                static const Atom wmProtocols = sf::priv::getAtom("WM_PROTOCOLS");
                return event->xclient.message_type != wmProtocols;
            }
            return false;
        }